

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderIntPrecisionCase::deinit(ShaderIntPrecisionCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ShaderIntPrecisionCase *this_local;
  
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  if (this->m_framebuffer != 0) {
    pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,&this->m_framebuffer);
  }
  if (this->m_renderbuffer != 0) {
    pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x460))(1,&this->m_renderbuffer);
  }
  this->m_program = (ShaderProgram *)0x0;
  this->m_framebuffer = 0;
  this->m_renderbuffer = 0;
  return;
}

Assistant:

void ShaderIntPrecisionCase::deinit (void)
{
	delete m_program;

	if (m_framebuffer)
		m_context.getRenderContext().getFunctions().deleteFramebuffers(1, &m_framebuffer);

	if (m_renderbuffer)
		m_context.getRenderContext().getFunctions().deleteRenderbuffers(1, &m_renderbuffer);

	m_program		= DE_NULL;
	m_framebuffer	= 0;
	m_renderbuffer	= 0;
}